

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O1

void sprite_evaluation(uint16_t scanline,uint16_t dot,uint8_t sprite_size)

{
  uint8_t uVar1;
  _Bool _Var2;
  byte bVar3;
  ushort uVar4;
  undefined2 in_register_00000032;
  ushort uVar5;
  
  uVar1 = oam_data;
  if (CONCAT22(in_register_00000032,dot) == 0x41) {
    sprite_overflow = 0;
    secondary_overflow = false;
    primary_overflow = false;
    secondary_OAM_addr = '\0';
  }
  _Var2 = primary_overflow;
  if ((dot & 1) != 0) {
    oam_data = primary_OAM[primary_OAM_addr];
    return;
  }
  bVar3 = secondary_overflow | primary_overflow;
  if ((bVar3 & 1) == 0) {
    secondary_OAM[secondary_OAM_addr] = oam_data;
  }
  else {
    oam_data = secondary_OAM[secondary_OAM_addr];
  }
  if (sprite_evaluation::bytes_left_to_copy == '\0') {
    uVar5 = scanline - uVar1;
    uVar4 = (ushort)sprite_size;
    if (dot == 0x42) {
      sprite0_on_next_scanline = uVar5 < uVar4;
    }
    if ((bVar3 & 1) != 0 || uVar4 <= uVar5) {
      if (overflow_detection == false) {
        primary_OAM_addr = (primary_OAM_addr & 0xfc) + 4;
        bVar3 = primary_OAM_addr;
      }
      else {
        if (_Var2 == false && uVar5 < uVar4) {
          sprite_overflow = 1;
          overflow_detection = false;
          return;
        }
        bVar3 = (primary_OAM_addr & 0xfc) + 4;
        primary_OAM_addr = primary_OAM_addr + 1 & 3 | bVar3;
      }
      if (bVar3 == 0) {
        primary_overflow = true;
      }
      return;
    }
    sprite_evaluation::bytes_left_to_copy = '\x03';
  }
  else {
    sprite_evaluation::bytes_left_to_copy = sprite_evaluation::bytes_left_to_copy + 0xff;
  }
  primary_overflow = primary_OAM_addr == 0xff;
  overflow_detection = secondary_OAM_addr == 0xff;
  secondary_OAM_addr = secondary_OAM_addr + '\x01';
  primary_OAM_addr = primary_OAM_addr + '\x01';
  secondary_overflow = overflow_detection;
  return;
}

Assistant:

void sprite_evaluation(uint16_t scanline, uint16_t dot, uint8_t sprite_size) {
    static uint8_t bytes_left_to_copy = 0;

    if(dot == 65) {
        primary_overflow = secondary_overflow = sprite_overflow = false;
        set_secondary_OAM_address(0);
    }
    if(is_odd_cycle(dot)) {
        oam_data = primary_OAM[primary_OAM_addr];
        return;
    }

    uint8_t const orig_oam_data = oam_data;

    if(!is_OAM_overflow())
        secondary_OAM[secondary_OAM_addr] = oam_data;
    else
        oam_data = secondary_OAM[secondary_OAM_addr];

    if(bytes_left_to_copy > 0) {
        bytes_left_to_copy--;
        increment_OAM_addresses();
        return;
    }

    bool const in_range = sprite_in_range(scanline, orig_oam_data, sprite_size);

    if(dot == 66)
        sprite0_on_next_scanline = in_range;

    if(in_range && !is_OAM_overflow()) {
        bytes_left_to_copy = 3;
        increment_OAM_addresses();
        return;
    }

    if(!overflow_detection) {
        primary_OAM_addr = (primary_OAM_addr + 4) & 0xFC;
        if(primary_OAM_addr == 0)
            primary_overflow = true;
    }
    else {
        if(in_range && !primary_overflow) {
            sprite_overflow = true;
            overflow_detection = false;
        }
        else {
            primary_OAM_addr = ((primary_OAM_addr + 4) & 0xFC) | ((primary_OAM_addr + 1) & 0x3);
            if((primary_OAM_addr & 0xFC) == 0)
                primary_overflow = true;
        }
    }
}